

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QVariant * __thiscall QFileSystemModel::myComputer(QFileSystemModel *this,int role)

{
  pointer this_00;
  QAbstractFileIconProvider *pQVar1;
  int in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QAbstractFileIconProvider *provider;
  QFileSystemModelPrivate *d;
  QVariant *this_01;
  undefined1 local_28 [8];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  d_func((QFileSystemModel *)0xaa4fda);
  if (in_EDX == 0) {
    QFileSystemModelPrivate::myComputer();
    ::QVariant::QVariant(in_RDI,(QString *)local_20);
    QString::~QString((QString *)0xaa501a);
  }
  else {
    if (in_EDX == 1) {
      this_00 = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::
                operator->((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *
                           )0xaa502d);
      pQVar1 = QFileInfoGatherer::iconProvider((QFileInfoGatherer *)this_00);
      if (pQVar1 != (QAbstractFileIconProvider *)0x0) {
        (*pQVar1->_vptr_QAbstractFileIconProvider[2])(local_28,pQVar1,0);
        QIcon::operator_cast_to_QVariant((QIcon *)in_RDI);
        QIcon::~QIcon((QIcon *)this_01);
        goto LAB_00aa5079;
      }
    }
    ::QVariant::QVariant((QVariant *)0xaa5079);
  }
LAB_00aa5079:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QVariant QFileSystemModel::myComputer(int role) const
{
#if QT_CONFIG(filesystemwatcher)
    Q_D(const QFileSystemModel);
#endif
    switch (role) {
    case Qt::DisplayRole:
        return QFileSystemModelPrivate::myComputer();
#if QT_CONFIG(filesystemwatcher)
    case Qt::DecorationRole:
        if (auto *provider = d->fileInfoGatherer->iconProvider())
            return provider->icon(QAbstractFileIconProvider::Computer);
    break;
#endif
    }
    return QVariant();
}